

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::createAdvanceCall(FunctionResolver *this,CallOrCast *c)

{
  CallOrCastBase *pCVar1;
  size_t sVar2;
  Expression *pEVar3;
  CompileMessage local_98;
  CompileMessage local_50;
  CallOrCast *local_18;
  CallOrCast *c_local;
  FunctionResolver *this_local;
  
  local_18 = c;
  c_local = (CallOrCast *)this;
  if (((c->super_CallOrCastBase).isMethodCall & 1U) != 0) {
    Errors::advanceIsNotAMethod<>();
    AST::Context::throwError
              (&(c->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context,
               &local_50,false);
  }
  sVar2 = AST::CallOrCastBase::getNumArguments(&c->super_CallOrCastBase);
  if (sVar2 != 0) {
    pCVar1 = &local_18->super_CallOrCastBase;
    Errors::advanceHasNoArgs<>();
    AST::Context::throwError
              (&(pCVar1->super_Expression).super_Statement.super_ASTObject.context,&local_98,false);
  }
  pEVar3 = &AST::Allocator::allocate<soul::AST::AdvanceClock,soul::AST::Context&>
                      ((this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                       &(local_18->super_CallOrCastBase).super_Expression.super_Statement.
                        super_ASTObject.context)->super_Expression;
  return pEVar3;
}

Assistant:

AST::Expression& createAdvanceCall (AST::CallOrCast& c)
        {
            if (c.isMethodCall)             c.context.throwError (Errors::advanceIsNotAMethod());
            if (c.getNumArguments() != 0)   c.context.throwError (Errors::advanceHasNoArgs());

            return allocator.allocate<AST::AdvanceClock> (c.context);
        }